

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::Transform_const&,pbrt::Transform_const&,float_const&,float_const&,bool_const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Quaternion_const&,pbrt::Quaternion_const&,pbrt::SquareMatrix<4>const&,pbrt::SquareMatrix<4>const&,bool_const&>
               (string *s,char *fmt,Transform *v,Transform *args,float *args_1,float *args_2,
               bool *args_3,Vector3<float> *args_4,Vector3<float> *args_5,Quaternion *args_6,
               Quaternion *args_7,SquareMatrix<4> *args_8,SquareMatrix<4> *args_9,bool *args_10)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *fmt_00;
  ulong uVar4;
  char *in_RCX;
  string *in_RDX;
  string *in_RDI;
  Transform *in_R8;
  float *in_R9;
  Vector3<float> *unaff_R14;
  Vector3<float> *unaff_R15;
  Quaternion *unaff_retaddr;
  Quaternion *in_stack_00000008;
  SquareMatrix<4> *in_stack_00000010;
  SquareMatrix<4> *in_stack_00000018;
  bool *in_stack_00000020;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  Transform *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd60;
  char **in_stack_fffffffffffffd68;
  char **in_stack_fffffffffffffd70;
  Transform *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  string local_260 [32];
  undefined8 local_240;
  string local_238 [16];
  char *in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  LogLevel in_stack_fffffffffffffdf4;
  string local_78 [16];
  bool *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffa0;
  
  copyToFormatString(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  lVar1 = std::__cxx11::string::find((char)local_78,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_78,0x73);
  lVar3 = std::__cxx11::string::find((char)local_78,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
             in_stack_fffffffffffffdd8);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
             in_stack_fffffffffffffdd8);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
               in_stack_fffffffffffffdd8);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::Transform_const&>(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd80);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffde8);
    pbrt::operator<<(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    fmt_00 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_240 = std::__cxx11::string::c_str();
    formatOne<char_const*>(fmt_00,in_stack_fffffffffffffd70);
    std::__cxx11::string::operator+=(in_RDI,local_238);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffde8);
  }
  stringPrintfRecursive<pbrt::Transform_const&,float_const&,float_const&,bool_const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Quaternion_const&,pbrt::Quaternion_const&,pbrt::SquareMatrix<4>const&,pbrt::SquareMatrix<4>const&,bool_const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,unaff_R14
             ,unaff_R15,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
             in_stack_00000020);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}